

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::rtl_draw(Fl_Xlib_Graphics_Driver *this,char *c,int n,int x,int y)

{
  Display *display;
  Window d;
  Fl_Font_Descriptor *pFVar1;
  int y_local;
  int x_local;
  int n_local;
  char *c_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  if (font_gc != fl_gc) {
    pFVar1 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
    if (pFVar1 == (Fl_Font_Descriptor *)0x0) {
      (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
                (this,0,(ulong)(uint)FL_NORMAL_SIZE);
    }
    font_gc = fl_gc;
  }
  d = fl_window;
  display = fl_display;
  if (fl_gc != (GC)0x0) {
    pFVar1 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
    XUtf8DrawRtlString(display,d,pFVar1->font,fl_gc,x,y,c,n);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::rtl_draw(const char* c, int n, int x, int y) {
  if (font_gc != fl_gc) {
    if (!font_descriptor()) this->font(FL_HELVETICA, FL_NORMAL_SIZE);
    font_gc = fl_gc;
  }
  if (fl_gc) XUtf8DrawRtlString(fl_display, fl_window, font_descriptor()->font, fl_gc, x, y, c, n);
}